

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::update_tracker_timer(torrent *this,time_point32 now)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  element_type *peVar4;
  service_type *psVar5;
  state_t sVar6;
  pointer ptVar7;
  node_ptr plVar8;
  bool bVar9;
  bool bVar10;
  char cVar11;
  ushort uVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ptVar14;
  pointer ptVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar17;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  node_ptr this_00;
  pointer ptVar18;
  undefined8 in_RDX;
  long lVar19;
  int iVar20;
  ulong uVar21;
  undefined4 in_register_00000034;
  ulong uVar22;
  long lVar23;
  undefined8 uVar24;
  node_ptr plVar25;
  array<const_bool,_2UL> aVar26;
  pointer ptVar27;
  ulong uVar28;
  undefined1 local_d8 [8];
  wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  int local_b4;
  uint local_a4;
  vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  listen_socket_states;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  node_ptr local_60;
  node_ptr local_58;
  pointer local_50;
  ulong local_48;
  ulong local_40;
  node_ptr local_38;
  
  local_68 = CONCAT44(in_register_00000034,now.__d.__r);
  if ((this->field_0x5c0 & 0x40) == 0) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    (*UNRECOVERED_JUMPTABLE)
              (this,"*** update tracker timer: not announcing",in_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  bVar9 = digest32<160L>::is_all_zeros(&(this->m_info_hash).v1);
  bVar10 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
  aVar26._M_elems = (_Type)(bVar9 ^ 1 | (ushort)!bVar10 << 8);
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listen_socket_states.
  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  supports_protocol.super_array<const_bool,_2UL>._M_elems =
       (array<const_bool,_2UL>)(array<const_bool,_2UL>)aVar26._M_elems;
  iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar13 != '\0') {
    iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    local_d8 = (undefined1  [8])(CONCAT44(extraout_var,iVar13) + 0x438);
    local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)((ulong)local_d0 & 0xffffffffffffff00);
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
    local_d0._0_1_ = true;
    uVar2 = *(uint *)(CONCAT44(extraout_var,iVar13) + 0x428);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
    iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    local_d8 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar13) + 0x438);
    local_d0._0_1_ = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
    local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)CONCAT71(local_d0._1_7_,1);
    uVar3 = *(uint *)(CONCAT44(extraout_var_00,iVar13) + 0x428);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,
               "*** update_tracker_timer: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
               ,(ulong)(uVar2 >> 0x11 & 1),(ulong)(uVar3 >> 0x12 & 1),
               (ulong)(uint)(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.
                            super_size_traits.size_);
  }
  plVar25 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node;
  local_a4 = 0xffffffff;
  local_b4 = 0x7fffffff;
  ptVar15 = (pointer)0x0;
  ptVar14 = (pointer)0x0;
  local_60 = plVar25;
  while (plVar25 = ((node *)&plVar25->next_)->next_, plVar25 != local_60) {
    local_a4 = local_a4 + 1;
    this_00 = plVar25[5].next_;
    local_58 = plVar25[5].prev_;
    ptVar18 = ptVar15;
    if (this_00 != plVar25[5].prev_) {
      do {
        ptVar14 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_;
        uVar21 = (long)ptVar18 -
                 (long)listen_socket_states.
                       super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        ptVar15 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = uVar21;
        if (0 < (long)uVar21 >> 7) {
          ptVar15 = (pointer)((long)&(((timer_state *)
                                      (&(listen_socket_states.
                                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->state + -1))->
                                     socket).m_sock.
                                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + (uVar21 & 0xffffffffffffff80));
          lVar19 = ((long)uVar21 >> 7) + 1;
          ptVar27 = listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if (ptVar27[-2].socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == p_Var16) {
              ptVar27 = ptVar27 + -2;
              goto LAB_00316668;
            }
            if (ptVar27[-1].socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == p_Var16) {
              ptVar27 = ptVar27 + -1;
              goto LAB_00316668;
            }
            if ((ptVar27->socket).m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == p_Var16) goto LAB_00316668;
            if (ptVar27[1].socket.m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == p_Var16) {
              ptVar27 = ptVar27 + 1;
              goto LAB_00316668;
            }
            lVar19 = lVar19 + -1;
            ptVar27 = ptVar27 + 4;
          } while (1 < lVar19);
          uVar22 = (long)ptVar18 - (long)ptVar15;
        }
        lVar19 = (long)uVar22 >> 5;
        if (lVar19 == 1) {
LAB_0031664b:
          ptVar27 = ptVar15;
          if ((ptVar15->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != p_Var16) {
            ptVar27 = ptVar18;
          }
LAB_00316668:
          if (ptVar27 == ptVar18) goto LAB_00316677;
        }
        else {
          if (lVar19 == 2) {
LAB_00316641:
            ptVar27 = ptVar15;
            if ((ptVar15->socket).m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != p_Var16) {
              ptVar15 = ptVar15 + 1;
              goto LAB_0031664b;
            }
            goto LAB_00316668;
          }
          if (lVar19 == 3) {
            ptVar27 = ptVar15;
            if ((ptVar15->socket).m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != p_Var16) {
              ptVar15 = ptVar15 + 1;
              goto LAB_00316641;
            }
            goto LAB_00316668;
          }
LAB_00316677:
          if (ptVar18 ==
              listen_socket_states.
              super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            if (uVar21 == 0x7fffffffffffffe0) {
              ::std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar21 = (long)uVar21 >> 5;
            uVar22 = uVar21;
            if (ptVar18 ==
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar22 = 1;
            }
            uVar28 = uVar22 + uVar21;
            if (0x3fffffffffffffe < uVar28) {
              uVar28 = 0x3ffffffffffffff;
            }
            if (CARRY8(uVar22,uVar21)) {
              uVar28 = 0x3ffffffffffffff;
            }
            if (uVar28 == 0) {
              ptVar15 = (pointer)0x0;
            }
            else {
              ptVar15 = (pointer)operator_new(uVar28 << 5);
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[0xc].next_;
            }
            peVar4 = (element_type *)this_00[0xb].prev_;
            if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var16->_M_weak_count = p_Var16->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                p_Var16->_M_weak_count = p_Var16->_M_weak_count + 1;
              }
            }
            ptVar15[uVar21].socket.m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar4;
            ptVar15[uVar21].socket.m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = p_Var16;
            lVar19 = 0;
            do {
              *(undefined4 *)
               ((long)&ptVar15[uVar21].state.
                       super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                       ._M_elems[0].tier + lVar19) = 0x7fffffff;
              *(undefined2 *)
               (&ptVar15[uVar21].state.
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[0].found_working + lVar19) = 0;
              lVar19 = lVar19 + 8;
              ptVar27 = ptVar15;
              ptVar7 = ptVar14;
            } while (lVar19 != 0x10);
            for (; ptVar18 != ptVar7; ptVar7 = ptVar7 + 1) {
              p_Var16 = (ptVar7->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (ptVar27->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (ptVar7->socket).m_sock.
                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
              (ptVar27->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = p_Var16;
              (ptVar7->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              (ptVar7->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              sVar6 = (ptVar7->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                      ._M_elems[1];
              (ptVar27->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[0] = (ptVar7->state).
                            super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                            ._M_elems[0];
              (ptVar27->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[1] = sVar6;
              ptVar27 = ptVar27 + 1;
            }
            if (ptVar14 != (pointer)0x0) {
              operator_delete(ptVar14,(long)listen_socket_states.
                                            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)ptVar14);
            }
            ptVar18 = ptVar27 + 1;
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_start = ptVar15;
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_finish = ptVar18;
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = ptVar15 + uVar28;
          }
          else {
            peVar4 = (element_type *)this_00[0xb].prev_;
            if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var16->_M_weak_count = p_Var16->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                p_Var16->_M_weak_count = p_Var16->_M_weak_count + 1;
              }
            }
            (ptVar18->socket).m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar4;
            (ptVar18->socket).m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = p_Var16;
            lVar19 = 0;
            do {
              *(undefined4 *)
               ((long)&(ptVar18->state).
                       super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                       ._M_elems[0].tier + lVar19) = 0x7fffffff;
              *(undefined2 *)
               (&(ptVar18->state).
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[0].found_working + lVar19) = 0;
              lVar19 = lVar19 + 8;
            } while (lVar19 != 0x10);
            ptVar18 = listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 1;
            listen_socket_states.
            super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
            ._M_impl.super__Vector_impl_data._M_finish = ptVar18;
          }
          ptVar27 = ptVar18 + -1;
          listen_socket_states.
          super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
          ._M_impl.super__Vector_impl_data._M_finish = ptVar18;
        }
        local_50 = ptVar18;
        if (((ulong)this_00[0xb].next_ & 1) != 0) {
          local_38 = this_00 + 2;
          lVar19 = 0;
          do {
            uVar22 = (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar19];
            if ((supports_protocol.super_array<const_bool,_2UL>._M_elems[uVar22] == true) &&
               ((ptVar27->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[uVar22].done == false)) {
              iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
              plVar8 = local_38;
              if ((char)iVar13 != '\0') {
                print_endpoint_abi_cxx11_((string *)local_d8,(aux *)this_00,(endpoint *)local_38);
                local_40 = (ulong)(byte)*(undefined1 *)((long)&plVar25[6].prev_ + 4);
                local_48 = (ulong)(uint)(ptVar27->state).
                                        super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                                        ._M_elems[uVar22].tier;
                uVar12 = *(ushort *)((long)plVar8 + uVar22 * 0x48 + 0x44);
                (*(this->super_request_callback)._vptr_request_callback[7])
                          (this,
                           "*** tracker: (%d) [ep: %s ] \"%s\" [ found: %d i->tier: %d tier: %d working: %d fails: %d limit: %d upd: %d ]"
                           ,(ulong)local_a4,local_d8,plVar25[1].next_,
                           (ulong)(ptVar27->state).
                                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                                  ._M_elems[uVar22].found_working,local_40,local_48,
                           (ulong)((uVar12 & 0x7f) == 0),(ulong)(uVar12 & 0x7f),
                           (ulong)(byte)*(undefined1 *)((long)&plVar25[6].prev_ + 5),
                           (ulong)(uVar12 >> 7 & 1));
                if (local_d8 != (undefined1  [8])&aStack_c8) {
                  operator_delete((void *)local_d8,aStack_c8._M_allocated_capacity + 1);
                }
              }
              iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                         _vptr_session_logger[0x2e])();
              local_d8 = (undefined1  [8])(CONCAT44(extraout_var_01,iVar13) + 0x438);
              local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)((ulong)local_d0 & 0xffffffffffffff00);
              ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
              local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          *)CONCAT71(local_d0._1_7_,1);
              uVar2 = *(uint *)(CONCAT44(extraout_var_01,iVar13) + 0x428);
              ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
              if ((uVar2 >> 0x11 & 1) != 0) {
                iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0x2e])();
                local_d8 = (undefined1  [8])(CONCAT44(extraout_var_02,iVar13) + 0x438);
                local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)((ulong)local_d0 & 0xffffffffffffff00);
                ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
                local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)CONCAT71(local_d0._1_7_,1);
                uVar2 = *(uint *)(CONCAT44(extraout_var_02,iVar13) + 0x428);
                ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
                if ((((uVar2 >> 0x12 & 1) == 0) &&
                    ((ptVar27->state).
                     super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                     _M_elems[uVar22].found_working == true)) &&
                   (iVar13 = (ptVar27->state).
                             super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                             ._M_elems[uVar22].tier,
                   (int)(uint)(byte)*(undefined1 *)((long)&plVar25[6].prev_ + 4) <= iVar13 &&
                   iVar13 != 0x7fffffff)) goto LAB_00316b67;
              }
              bVar1 = *(undefined1 *)((long)&plVar25[6].prev_ + 4);
              if ((ptVar27->state).
                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                  _M_elems[uVar22].tier < (int)(uint)bVar1) {
                iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0x2e])();
                local_d8 = (undefined1  [8])(CONCAT44(extraout_var_03,iVar13) + 0x438);
                local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)((ulong)local_d0 & 0xffffffffffffff00);
                ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
                local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)CONCAT71(local_d0._1_7_,1);
                uVar2 = *(uint *)(CONCAT44(extraout_var_03,iVar13) + 0x428);
                ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
                if ((uVar2 >> 0x11 & 1) == 0) break;
                (ptVar27->state).
                super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                _M_elems[uVar22].found_working = false;
                bVar1 = *(undefined1 *)((long)&plVar25[6].prev_ + 4);
              }
              (ptVar27->state).
              super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
              _M_elems[uVar22].tier = (uint)bVar1;
              uVar12 = *(ushort *)((long)plVar8 + uVar22 * 0x48 + 0x44);
              bVar1 = *(undefined1 *)((long)&plVar25[6].prev_ + 5);
              if ((bVar1 == 0) || ((uVar12 & 0x7f) < (ushort)bVar1)) {
                if ((char)uVar12 < '\0') {
                  (ptVar27->state).
                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                  _M_elems[uVar22].found_working = true;
                  uVar12 = *(ushort *)((long)plVar8 + uVar22 * 0x48 + 0x44);
                }
                else {
                  iVar13 = *(int *)((long)plVar8 + uVar22 * 0x48 + 0x30);
                  iVar20 = *(int *)((long)plVar8 + uVar22 * 0x48 + 0x34);
                  if (iVar20 < iVar13) {
                    iVar20 = iVar13;
                  }
                  if (iVar20 < local_b4) {
                    local_b4 = iVar20;
                  }
                }
                if ((uVar12 & 0x7f) == 0) {
                  (ptVar27->state).
                  super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                  _M_elems[uVar22].found_working = true;
                }
                else if (((ptVar27->state).
                          super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>
                          ._M_elems[uVar22].found_working & 1U) == 0) goto LAB_00316b67;
                iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                           _vptr_session_logger[0x2e])();
                local_d8 = (undefined1  [8])(CONCAT44(extraout_var_04,iVar13) + 0x438);
                local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)((ulong)local_d0 & 0xffffffffffffff00);
                ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
                local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)CONCAT71(local_d0._1_7_,1);
                uVar2 = *(uint *)(CONCAT44(extraout_var_04,iVar13) + 0x428);
                ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
                if ((uVar2 >> 0x12 & 1) == 0) {
                  iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                             _vptr_session_logger[0x2e])();
                  local_d8 = (undefined1  [8])(CONCAT44(extraout_var_05,iVar13) + 0x438);
                  local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                              *)((ulong)local_d0 & 0xffffffffffffff00);
                  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
                  local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                              *)CONCAT71(local_d0._1_7_,1);
                  uVar2 = *(uint *)(CONCAT44(extraout_var_05,iVar13) + 0x428);
                  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
                  if ((uVar2 >> 0x11 & 1) == 0) {
                    (ptVar27->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                    _M_elems[uVar22].done = true;
                  }
                }
              }
            }
LAB_00316b67:
            lVar19 = lVar19 + 1;
          } while (lVar19 != 2);
        }
        this_00 = (node_ptr)&this_00[0xc].prev_;
        ptVar14 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ptVar15 = listen_socket_states.
                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ptVar18 = local_50;
        aVar26 = supports_protocol.super_array<const_bool,_2UL>._M_elems;
      } while (this_00 != local_58);
    }
    local_d8[0] = aVar26._M_elems[0];
    local_d8[1] = aVar26._M_elems[1];
    uVar22 = (long)ptVar15 - (long)ptVar14;
    ptVar18 = ptVar14;
    if (0 < (long)uVar22 >> 7) {
      ptVar27 = (pointer)((long)&(((timer_state *)(&ptVar14->state + -1))->socket).m_sock.
                                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + (uVar22 & 0xffffffffffffff80));
      lVar19 = (long)uVar22 >> 7;
      do {
        lVar23 = 0;
        do {
          if ((local_d8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]] == '\x01')
             && ((ptVar18->state).
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]].done !=
                 true)) goto LAB_00316d1b;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 2);
        lVar23 = 0;
        do {
          if ((local_d8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]] == '\x01')
             && (ptVar18[1].state.
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]].done !=
                 true)) {
            ptVar18 = ptVar18 + 1;
            goto LAB_00316d1b;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != 2);
        lVar23 = 0;
        do {
          if ((local_d8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]] == '\x01')
             && (ptVar18[2].state.
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]].done !=
                 true)) {
            ptVar18 = ptVar18 + 2;
            goto LAB_00316d1b;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != 2);
        lVar23 = 0;
        do {
          if ((local_d8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]] == '\x01')
             && (ptVar18[3].state.
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar23]].done !=
                 true)) {
            ptVar18 = ptVar18 + 3;
            goto LAB_00316d1b;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != 2);
        ptVar18 = ptVar18 + 4;
        bVar9 = 1 < lVar19;
        lVar19 = lVar19 + -1;
      } while (bVar9);
      uVar22 = (long)ptVar15 - (long)ptVar27;
      ptVar18 = ptVar27;
    }
    lVar19 = (long)uVar22 >> 5;
    if (lVar19 != 1) {
      if (lVar19 != 2) {
        if (lVar19 != 3) break;
        lVar19 = 0;
        do {
          if ((local_d8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar19]] == '\x01')
             && ((ptVar18->state).
                 super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
                 _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar19]].done !=
                 true)) goto LAB_00316d1b;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 2);
        ptVar18 = ptVar18 + 1;
      }
      lVar19 = 0;
      do {
        if ((local_d8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar19]] == '\x01')
           && ((ptVar18->state).
               super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>.
               _M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar19]].done !=
               true)) goto LAB_00316d1b;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 2);
      ptVar18 = ptVar18 + 1;
    }
    lVar19 = 0;
    while ((local_d8[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar19]] != '\x01' ||
           ((ptVar18->state).
            super_array<libtorrent::aux::(anonymous_namespace)::timer_state::state_t,_2UL>._M_elems
            [(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar19]].done == true))) {
      lVar19 = lVar19 + 1;
      if (lVar19 == 2) goto LAB_00316d24;
    }
LAB_00316d1b:
    if (ptVar18 == ptVar15) break;
  }
LAB_00316d24:
  iVar13 = (int)local_68;
  iVar20 = iVar13 + 0x3c;
  if (local_b4 != 0x7fffffff) {
    iVar20 = local_b4;
  }
  if (local_b4 <= iVar13) {
    iVar20 = iVar13;
  }
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,
             "*** update tracker timer: before_now: %d none_eligible: %d m_waiting_tracker: %d next_announce_in: %d"
             ,(ulong)(local_b4 <= iVar13),(ulong)(iVar13 < local_b4 && local_b4 == 0x7fffffff),
             (ulong)(uint)(int)this->m_waiting_tracker,(ulong)(uint)(iVar20 - iVar13));
  cVar11 = this->m_waiting_tracker;
  if ((cVar11 == '\0') ||
     ((this->m_tracker_timer).impl_.implementation_.expiry.__d.__r != (long)iVar20 * 1000000000)) {
    if ((this->m_tracker_timer).impl_.implementation_.might_have_pending_waits == true) {
      psVar5 = (this->m_tracker_timer).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar5->scheduler_,&psVar5->timer_queue_,
                 &(this->m_tracker_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_tracker_timer).impl_.implementation_.might_have_pending_waits = false;
      cVar11 = this->m_waiting_tracker;
    }
    (this->m_tracker_timer).impl_.implementation_.expiry.__d.__r = (long)iVar20 * 1000000000;
    this->m_waiting_tracker = cVar11 + '\x01';
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)
               local_78._M_local_buf,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    psVar5 = (this->m_tracker_timer).impl_.service_;
    local_d8 = (undefined1  [8])&local_78;
    plVar17 = (long *)__tls_get_addr(&PTR_004eaf08);
    if (*plVar17 == 0) {
      uVar24 = 0;
    }
    else {
      uVar24 = *(undefined8 *)(*plVar17 + 8);
    }
    op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          *)boost::asio::detail::thread_info_base::
            allocate<boost::asio::detail::thread_info_base::default_tag>(uVar24,0x68);
    uVar24 = local_78._8_8_;
    (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
    (op->super_wait_op).super_operation.func_ =
         boost::asio::detail::
         wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
         ::do_complete;
    (op->super_wait_op).super_operation.task_result_ = 0;
    (op->super_wait_op).ec_.val_ = 0;
    (op->super_wait_op).ec_.failed_ = false;
    (op->super_wait_op).ec_.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (op->handler_).self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_78._M_allocated_capacity;
    (op->handler_).self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
    local_78._M_allocated_capacity = 0;
    local_d0 = op;
    boost::asio::detail::
    handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
    ::handler_work_base(&(op->work_).
                         super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                        ,&(this->m_tracker_timer).impl_.executor_);
    (this->m_tracker_timer).impl_.implementation_.might_have_pending_waits = true;
    aStack_c8._M_allocated_capacity = (size_type)op;
    boost::asio::detail::epoll_reactor::
    schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
              (psVar5->scheduler_,&psVar5->timer_queue_,
               &(this->m_tracker_timer).impl_.implementation_.expiry,
               &(this->m_tracker_timer).impl_.implementation_.timer_data,(wait_op *)op);
    local_d0 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
    aStack_c8._M_allocated_capacity = 0;
    boost::asio::detail::
    wait_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:10096:30),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::ptr::reset((ptr *)local_d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  ::std::
  vector<libtorrent::aux::(anonymous_namespace)::timer_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::timer_state>_>
  ::~vector(&listen_socket_states);
  return;
}

Assistant:

void torrent::update_tracker_timer(time_point32 const now)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_announcing)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** update tracker timer: not announcing");
#endif
			return;
		}

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
		{
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 next_announce = time_point32::max();

		std::vector<timer_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** update_tracker_timer: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif
		for (auto const& t : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			for (auto const& aep : t.endpoints)
			{
				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](timer_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				timer_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;
				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto const& a = aep.info_hashes[ih];

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker: (%d) [ep: %s ] \"%s\" ["
							" found: %d i->tier: %d tier: %d"
							" working: %d fails: %d limit: %d upd: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str(), t.url.c_str()
							, state.found_working, t.tier, state.tier, a.is_working()
							, a.fails, t.fail_limit, a.updating);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.found_working
						&& t.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (t.tier > state.tier)
					{
						if (!settings().get_bool(settings_pack::announce_to_all_tiers)) break;
						state.found_working = false;
					}
					state.tier = t.tier;
					if (a.fails >= t.fail_limit && t.fail_limit != 0) continue;
					if (a.updating)
					{
						state.found_working = true;
					}
					else
					{
						time_point32 const next_tracker_announce = std::max(a.next_announce, a.min_announce);
						if (next_tracker_announce < next_announce)
							next_announce = next_tracker_announce;
					}
					if (a.is_working()) state.found_working = true;
					if (state.found_working
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
						state.done = true;
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](timer_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}

#ifndef TORRENT_DISABLE_LOGGING
		bool before_now = false;
		bool none_eligible = false;
#endif
		if (next_announce <= now)
		{
			next_announce = now;
#ifndef TORRENT_DISABLE_LOGGING
			before_now = true;
#endif
		}
		else if (next_announce == time_point32::max())
		{
			// if no tracker can be announced to, check again in a minute
			next_announce = now + minutes32(1);
#ifndef TORRENT_DISABLE_LOGGING
			none_eligible = true;
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** update tracker timer: "
			"before_now: %d "
			"none_eligible: %d "
			"m_waiting_tracker: %d "
			"next_announce_in: %d"
			, before_now
			, none_eligible
			, m_waiting_tracker
			, int(total_seconds(next_announce - now)));
#endif

		// don't re-issue the timer if it's the same expiration time as last time
		// if m_waiting_tracker is 0, expires_at() is undefined
		if (m_waiting_tracker && m_tracker_timer.expiry() == next_announce) return;

		m_tracker_timer.expires_at(next_announce);
		ADD_OUTSTANDING_ASYNC("tracker::on_tracker_announce");
		++m_waiting_tracker;
		m_tracker_timer.async_wait([self = shared_from_this()](error_code const& e)
			{ self->wrap(&torrent::on_tracker_announce, e); });
	}